

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O2

void * kmpc_malloc(size_t size)

{
  kmp_info_t *th;
  void *pvVar1;
  
  th = __kmp_entry_thread();
  pvVar1 = bget(th,size + 8);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    *(void **)pvVar1 = pvVar1;
    pvVar1 = (void *)((long)pvVar1 + 8);
  }
  return pvVar1;
}

Assistant:

void *
kmpc_malloc( size_t size )
{
    void * ptr;
    ptr = bget( __kmp_entry_thread(), (bufsize)(size + sizeof(ptr)) );
    if( ptr != NULL ) {
        // save allocated pointer just before one returned to user
        *(void**)ptr = ptr;
        ptr = (void**)ptr + 1;
    }
    return ptr;
}